

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_sig.c
# Opt level: O0

int dsa_sign(void *vpdsactx,uchar *sig,size_t *siglen,size_t sigsize,uchar *tbs,size_t tbslen)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar *in_RCX;
  ulong *in_RDX;
  long in_RSI;
  uint *in_RDI;
  undefined8 in_R8;
  uchar *in_R9;
  size_t mdsize;
  size_t dsasize;
  uint sltmp;
  int ret;
  PROV_DSA_CTX *pdsactx;
  PROV_DSA_CTX *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int dlen;
  int local_4;
  
  dlen = (int)((ulong)in_R8 >> 0x20);
  iVar1 = DSA_size(*(DSA **)(in_RDI + 4));
  puVar3 = (uchar *)dsa_get_md_size(in_stack_ffffffffffffffa8);
  iVar2 = ossl_prov_is_running();
  if (iVar2 == 0) {
    local_4 = 0;
  }
  else if (in_RSI == 0) {
    *in_RDX = (ulong)(long)iVar1;
    local_4 = 1;
  }
  else if (in_RCX < (uchar *)(long)iVar1) {
    local_4 = 0;
  }
  else if ((puVar3 == (uchar *)0x0) || (in_R9 == puVar3)) {
    iVar1 = ossl_dsa_sign_int((int)in_RDX,in_RCX,dlen,in_R9,in_RDI,
                              (DSA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      *in_RDX = (ulong)in_stack_ffffffffffffffb8;
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int dsa_sign(void *vpdsactx, unsigned char *sig, size_t *siglen,
                    size_t sigsize, const unsigned char *tbs, size_t tbslen)
{
    PROV_DSA_CTX *pdsactx = (PROV_DSA_CTX *)vpdsactx;
    int ret;
    unsigned int sltmp;
    size_t dsasize = DSA_size(pdsactx->dsa);
    size_t mdsize = dsa_get_md_size(pdsactx);

    if (!ossl_prov_is_running())
        return 0;

    if (sig == NULL) {
        *siglen = dsasize;
        return 1;
    }

    if (sigsize < (size_t)dsasize)
        return 0;

    if (mdsize != 0 && tbslen != mdsize)
        return 0;

    ret = ossl_dsa_sign_int(0, tbs, tbslen, sig, &sltmp, pdsactx->dsa);
    if (ret <= 0)
        return 0;

    *siglen = sltmp;
    return 1;
}